

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::error_code_const&>::
captureExpression<(Catch::Internal::Operator)0,io::net::stream_errc>
          (ExpressionLhs<std::error_code_const&> *this,stream_errc *rhs)

{
  int *piVar1;
  ResultBuilder *pRVar2;
  string local_88;
  string local_68;
  string local_48;
  
  pRVar2 = *(ResultBuilder **)this;
  piVar1 = *(int **)(this + 8);
  std::error_code::error_code<io::net::stream_errc,void>((error_code *)&local_48,*rhs);
  pRVar2 = ResultBuilder::setResultType
                     (pRVar2,*piVar1 == (int)local_48._M_dataplus._M_p &&
                             *(size_type *)(piVar1 + 2) == local_48._M_string_length);
  Detail::StringMakerBase<true>::convert<std::error_code>(&local_48,*(error_code **)(this + 8));
  pRVar2 = ResultBuilder::setLhs(pRVar2,&local_48);
  Detail::StringMakerBase<true>::convert<io::net::stream_errc>(&local_68,rhs);
  pRVar2 = ResultBuilder::setRhs(pRVar2,&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"==","");
  pRVar2 = ResultBuilder::setOp(pRVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  return pRVar2;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }